

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

void __thiscall smf::MidiEventList::clear(MidiEventList *this)

{
  MidiEvent *this_00;
  bool bVar1;
  reference ppMVar2;
  MidiEvent **item;
  iterator __end1;
  iterator __begin1;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *__range1;
  MidiEventList *this_local;
  
  __end1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::begin(&this->list);
  item = (MidiEvent **)
         std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::end(&this->list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
                                *)&item);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
              ::operator*(&__end1);
    if (*ppMVar2 != (MidiEvent *)0x0) {
      this_00 = *ppMVar2;
      if (this_00 != (MidiEvent *)0x0) {
        MidiEvent::~MidiEvent(this_00);
        operator_delete(this_00);
      }
      *ppMVar2 = (MidiEvent *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<smf::MidiEvent_**,_std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize(&this->list,0);
  return;
}

Assistant:

void MidiEventList::clear(void) {
	for (auto& item : list) {
		if (item != NULL) {
			delete item;
			item = NULL;
		}
	}
	list.resize(0);
}